

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

UBool isAcceptable(void *context,char *param_2,char *param_3,UDataInfo *pInfo)

{
  *(undefined4 *)context = *(undefined4 *)pInfo->formatVersion;
  if ((((((0x13 < pInfo->size) && (pInfo->isBigEndian == '\0')) && (pInfo->charsetFamily == '\0'))
       && ((pInfo->sizeofUChar == '\x02' && (pInfo->dataFormat[0] == 'R')))) &&
      ((pInfo->dataFormat[1] == 'e' &&
       ((pInfo->dataFormat[2] == 's' && (pInfo->dataFormat[3] == 'B')))))) &&
     (pInfo->formatVersion[0] != 0)) {
    return pInfo->formatVersion[0] < 4;
  }
  return '\0';
}

Assistant:

static UBool U_CALLCONV
isAcceptable(void *context,
             const char * /*type*/, const char * /*name*/,
             const UDataInfo *pInfo) {
    uprv_memcpy(context, pInfo->formatVersion, 4);
    return (UBool)(
        pInfo->size>=20 &&
        pInfo->isBigEndian==U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily==U_CHARSET_FAMILY &&
        pInfo->sizeofUChar==U_SIZEOF_UCHAR &&
        pInfo->dataFormat[0]==0x52 &&   /* dataFormat="ResB" */
        pInfo->dataFormat[1]==0x65 &&
        pInfo->dataFormat[2]==0x73 &&
        pInfo->dataFormat[3]==0x42 &&
        (1<=pInfo->formatVersion[0] && pInfo->formatVersion[0]<=3));
}